

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.hpp
# Opt level: O2

void __thiscall ot::commissioner::CommissionerApp::~CommissionerApp(CommissionerApp *this)

{
  ~CommissionerApp(this);
  operator_delete(this);
  return;
}

Assistant:

MOCKABLE ~CommissionerApp() = default;